

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O3

size_type __thiscall lf::base::RefEl::NumNodes(RefEl *this)

{
  runtime_error *this_00;
  
  if ((byte)(this->type_ - kPoint) < 4) {
    return (size_type)this->type_;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"RefEl::NumNodes() not implemented for this RefEl type.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] constexpr size_type NumNodes() const {
    switch (type_) {
      case RefElType::kPoint:
        return 1;
      case RefElType::kSegment:
        return 2;
      case RefElType::kTria:
        return 3;
      case RefElType::kQuad:
        return 4;
      default:
        throw std::runtime_error(
            "RefEl::NumNodes() not implemented for this RefEl type.");
    }
  }